

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser_fav.cpp
# Opt level: O0

bool __thiscall
CServerBrowserFavorites::AddFavoriteEx
          (CServerBrowserFavorites *this,char *pHostname,NETADDR *pAddr,bool DoCheck,char *pPassword
          )

{
  char *pcVar1;
  long lVar2;
  int iVar3;
  CFavoriteServer *pCVar4;
  byte in_CL;
  undefined8 *in_RDX;
  undefined8 in_RSI;
  NETADDR *in_RDI;
  CServerBrowserFavorites *in_R8;
  long in_FS_OFFSET;
  bool Result;
  CFavoriteServer *pExistingFavorite;
  char aBuf [256];
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  uint7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  byte bVar5;
  char *in_stack_fffffffffffffec0;
  bool local_109;
  char local_108 [96];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(in_RDI[0x7d5].ip + 4) == 0x100) {
    local_109 = false;
  }
  else {
    pCVar4 = FindFavoriteByHostname
                       (in_R8,in_stack_fffffffffffffec0,
                        (int *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
    if (pCVar4 == (CFavoriteServer *)0x0) {
      bVar5 = 0;
      iVar3 = net_addr_from_str((NETADDR *)(ulong)in_stack_fffffffffffffeb8,(char *)in_RDI);
      if (iVar3 == 0) {
        pCVar4 = FindFavoriteByAddr(in_R8,(NETADDR *)pCVar4,
                                    (int *)CONCAT17(bVar5,in_stack_fffffffffffffeb8));
        if (pCVar4 != (CFavoriteServer *)0x0) {
          local_109 = false;
          goto LAB_0013866f;
        }
        if ((in_CL & 1) != 0) {
          iVar3 = net_addr_comp((NETADDR *)CONCAT17(bVar5,in_stack_fffffffffffffeb8),in_RDI,
                                in_stack_fffffffffffffeac);
          if (iVar3 != 0) {
            local_109 = false;
            goto LAB_0013866f;
          }
        }
        *(undefined4 *)((long)in_RDI + (long)*(int *)(in_RDI[0x7d5].ip + 4) * 0xbc + 0xb8) = 3;
        bVar5 = 1;
      }
      else {
        if ((in_CL & 1) == 0) {
          pcVar1 = (char *)((long)in_RDI + (long)*(int *)(in_RDI[0x7d5].ip + 4) * 0xbc + 0xb8);
          pcVar1[0] = '\0';
          pcVar1[1] = '\0';
          pcVar1[2] = '\0';
          pcVar1[3] = '\0';
        }
        else {
          pcVar1 = (char *)((long)in_RDI + (long)*(int *)(in_RDI[0x7d5].ip + 4) * 0xbc + 0xb8);
          pcVar1[0] = '\x01';
          pcVar1[1] = '\0';
          pcVar1[2] = '\0';
          pcVar1[3] = '\0';
          iVar3 = *(int *)(in_RDI[0x7d5].ip + 4);
          *(undefined8 *)((long)in_RDI + (long)iVar3 * 0xbc + 0xa0) = *in_RDX;
          *(undefined8 *)((long)in_RDI + (long)iVar3 * 0xbc + 0xa8) = in_RDX[1];
          *(undefined8 *)((long)in_RDI + (long)iVar3 * 0xbc + 0xb0) = in_RDX[2];
        }
        *(int *)in_RDI[0x7de].ip = *(int *)in_RDI[0x7de].ip + 1;
      }
      str_copy((char *)in_RDI,(char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
               0);
      if (in_R8 == (CServerBrowserFavorites *)0x0) {
        *(undefined1 *)((long)in_RDI + (long)*(int *)(in_RDI[0x7d5].ip + 4) * 0xbc + 0x80) = 0;
      }
      else {
        str_copy((char *)in_RDI,
                 (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),0);
      }
      *(int *)(in_RDI[0x7d5].ip + 4) = *(int *)(in_RDI[0x7d5].ip + 4) + 1;
      if (*(int *)(*(long *)(in_RDI + 0x7df) + 0x1264) != 0) {
        str_format(local_108,0x100,"added fav \'%s\'",in_RSI);
        (**(code **)(**(long **)(in_RDI[0x7df].ip + 4) + 200))
                  (*(long **)(in_RDI[0x7df].ip + 4),2,"client_srvbrowse",local_108,0);
      }
      local_109 = (bool)(bVar5 & 1);
    }
    else {
      if (in_R8 == (CServerBrowserFavorites *)0x0) {
        pCVar4->m_aPassword[0] = '\0';
      }
      else {
        str_copy((char *)in_RDI,
                 (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),0);
      }
      local_109 = false;
    }
  }
LAB_0013866f:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return local_109;
  }
  __stack_chk_fail();
}

Assistant:

bool CServerBrowserFavorites::AddFavoriteEx(const char *pHostname, const NETADDR *pAddr, bool DoCheck, const char *pPassword)
{
	if(m_NumFavoriteServers == MAX_FAVORITES)
		return false;

	CFavoriteServer *pExistingFavorite = FindFavoriteByHostname(pHostname, 0);
	if(pExistingFavorite)
	{
		if(pPassword)
			str_copy(pExistingFavorite->m_aPassword, pPassword, sizeof(pExistingFavorite->m_aPassword));
		else
			pExistingFavorite->m_aPassword[0] = '\0';
		return false;
	}

	bool Result = false;
	// check if hostname is a net address string
	if(net_addr_from_str(&m_aFavoriteServers[m_NumFavoriteServers].m_Addr, pHostname) == 0)
	{
		// make sure that we don't already have the server in our list
		if(FindFavoriteByAddr(m_aFavoriteServers[m_NumFavoriteServers].m_Addr, 0) != 0)
			return false;

		// check if hostname does not match given address
		if(DoCheck && net_addr_comp(&m_aFavoriteServers[m_NumFavoriteServers].m_Addr, pAddr, true) != 0)
			return false;

		// add the server to the list
		m_aFavoriteServers[m_NumFavoriteServers].m_State = FAVSTATE_ADDR;
		Result = true;
	}
	else
	{
		// prepare for hostname lookup
		if(DoCheck)
		{
			m_aFavoriteServers[m_NumFavoriteServers].m_State = FAVSTATE_LOOKUPCHECK;
			m_aFavoriteServers[m_NumFavoriteServers].m_Addr = *pAddr;
		}
		else
			m_aFavoriteServers[m_NumFavoriteServers].m_State = FAVSTATE_LOOKUP;
		++m_FavLookup.m_LookupCount;
	}

	str_copy(m_aFavoriteServers[m_NumFavoriteServers].m_aHostname, pHostname, sizeof(m_aFavoriteServers[m_NumFavoriteServers].m_aHostname));

	if(pPassword)
		str_copy(m_aFavoriteServers[m_NumFavoriteServers].m_aPassword, pPassword, sizeof(m_aFavoriteServers[m_NumFavoriteServers].m_aPassword));
	else
		m_aFavoriteServers[m_NumFavoriteServers].m_aPassword[0] = '\0';

	++m_NumFavoriteServers;

	if(m_pConfig->m_Debug)
	{
		char aBuf[256];
		str_format(aBuf, sizeof(aBuf), "added fav '%s'", pHostname);
		m_pConsole->Print(IConsole::OUTPUT_LEVEL_DEBUG, "client_srvbrowse", aBuf);
	}

	return Result;
}